

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::swap
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *other)

{
  bool bVar1;
  half_storage hVar2;
  undefined8 uVar3;
  int64_t iVar4;
  semantic_tag sVar5;
  common_storage cVar6;
  int64_t iVar7;
  short_string_storage sStack_28;
  
  if (this == other) {
    return;
  }
  if (((~*(byte *)&this->field_0 & 0xc) != 0) &&
     ((~(byte)(other->field_0).json_const_pointer_ & 0xc) != 0)) {
    uVar3 = *(undefined8 *)&other->field_0;
    iVar7 = (other->field_0).int64_.val_;
    iVar4 = (this->field_0).int64_.val_;
    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
    (other->field_0).int64_.val_ = iVar4;
    *(undefined8 *)&this->field_0 = uVar3;
    (this->field_0).int64_.val_ = iVar7;
    sStack_28.data_[1] = 0x22f579;
    sStack_28.data_[2] = 0;
    ~basic_json((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                &stack0xffffffffffffffe8);
    return;
  }
  switch(*(byte *)&this->field_0 & 0xf) {
  case 0:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::null_storage>
              (this,other);
    return;
  case 1:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::bool_storage>
              (this,other);
    return;
  case 2:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::int64_storage>
              (this,other);
    return;
  case 3:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::uint64_storage>
              (this,other);
    return;
  case 4:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::empty_object_storage>
              (this,other);
    return;
  case 5:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::double_storage>
              (this,other);
    return;
  case 6:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::half_storage>
              (this,other);
    return;
  case 7:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
              (this,other);
    return;
  case 8:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
              (this,other);
    return;
  case 9:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              (this,other);
    return;
  case 0xc:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage>
              (this,other);
    return;
  case 0xd:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
              (this,other);
    return;
  case 0xe:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
              (this,other);
    return;
  case 0xf:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage>
              (this,other);
    return;
  }
  switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
  case 0:
  case 4:
    cVar6 = (other->field_0).common_;
    (other->field_0).common_ = (this->field_0).common_;
    break;
  case 1:
    bVar1 = (other->field_0).boolean_.val_;
    cVar6 = (other->field_0).common_;
    (other->field_0).common_ = (this->field_0).common_;
    (this->field_0).boolean_.val_ = bVar1;
    break;
  default:
    uVar3 = *(undefined8 *)&other->field_0;
    iVar7 = (other->field_0).int64_.val_;
    (other->field_0).common_ = (this->field_0).common_;
    *(undefined8 *)&this->field_0 = uVar3;
    (this->field_0).int64_.val_ = iVar7;
    return;
  case 6:
    hVar2 = (other->field_0).half_float_;
    (other->field_0).common_ = (this->field_0).common_;
    (this->field_0).half_float_ = hVar2;
    return;
  case 7:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::null_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
              ();
    return;
  case 10:
  case 0xb:
    switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
    case 0:
    case 4:
      cVar6 = (other->field_0).common_;
      (other->field_0).common_ = (this->field_0).common_;
      break;
    case 1:
      bVar1 = (other->field_0).boolean_.val_;
      cVar6 = (other->field_0).common_;
      (other->field_0).common_ = (this->field_0).common_;
      (this->field_0).boolean_.val_ = bVar1;
      break;
    default:
      uVar3 = *(undefined8 *)&other->field_0;
      iVar7 = (other->field_0).int64_.val_;
      (other->field_0).common_ = (this->field_0).common_;
      *(undefined8 *)&this->field_0 = uVar3;
      (this->field_0).int64_.val_ = iVar7;
      return;
    case 6:
      hVar2 = (other->field_0).half_float_;
      (other->field_0).common_ = (this->field_0).common_;
      (this->field_0).half_float_ = hVar2;
      return;
    case 7:
      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::empty_object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                ();
      return;
    case 10:
    case 0xb:
      switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
      case 0:
      case 4:
        cVar6 = (other->field_0).common_;
        (other->field_0).boolean_.val_ = (this->field_0).boolean_.val_;
        (other->field_0).common_ = (this->field_0).common_;
        goto LAB_0022f7c1;
      case 1:
        bVar1 = (other->field_0).boolean_.val_;
        cVar6 = (other->field_0).common_;
        (other->field_0).boolean_.val_ = (this->field_0).boolean_.val_;
        (other->field_0).common_ = (this->field_0).common_;
        (this->field_0).boolean_.val_ = bVar1;
LAB_0022f7c1:
        (this->field_0).common_ = cVar6;
        return;
      default:
        uVar3 = *(undefined8 *)&other->field_0;
        iVar7 = (other->field_0).int64_.val_;
        (other->field_0).boolean_.val_ = (this->field_0).boolean_.val_;
        (other->field_0).common_ = (this->field_0).common_;
        *(undefined8 *)&this->field_0 = uVar3;
        (this->field_0).int64_.val_ = iVar7;
        return;
      case 6:
        hVar2 = (other->field_0).half_float_;
        (other->field_0).boolean_.val_ = (this->field_0).boolean_.val_;
        (other->field_0).common_ = (this->field_0).common_;
        (this->field_0).half_float_ = hVar2;
        return;
      case 7:
        basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
        swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::bool_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                  ();
        return;
      case 10:
      case 0xb:
        switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
        case 0:
        case 4:
          cVar6 = (other->field_0).common_;
          iVar7 = (this->field_0).int64_.val_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).int64_.val_ = iVar7;
          goto LAB_0022f882;
        case 1:
          bVar1 = (other->field_0).boolean_.val_;
          cVar6 = (other->field_0).common_;
          iVar7 = (this->field_0).int64_.val_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).int64_.val_ = iVar7;
          (this->field_0).boolean_.val_ = bVar1;
LAB_0022f882:
          (this->field_0).common_ = cVar6;
          return;
        default:
          uVar3 = *(undefined8 *)&other->field_0;
          iVar7 = (other->field_0).int64_.val_;
          iVar4 = (this->field_0).int64_.val_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).int64_.val_ = iVar4;
          *(undefined8 *)&this->field_0 = uVar3;
          (this->field_0).int64_.val_ = iVar7;
          return;
        case 6:
          hVar2 = (other->field_0).half_float_;
          iVar7 = (this->field_0).int64_.val_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).int64_.val_ = iVar7;
          (this->field_0).half_float_ = hVar2;
          return;
        case 7:
          basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
          swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::int64_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                    ();
          return;
        case 10:
        case 0xb:
          switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
          case 0:
          case 4:
            cVar6 = (other->field_0).common_;
            iVar7 = (this->field_0).int64_.val_;
            *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
            (other->field_0).int64_.val_ = iVar7;
            goto LAB_0022f93e;
          case 1:
            bVar1 = (other->field_0).boolean_.val_;
            cVar6 = (other->field_0).common_;
            iVar7 = (this->field_0).int64_.val_;
            *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
            (other->field_0).int64_.val_ = iVar7;
            (this->field_0).boolean_.val_ = bVar1;
LAB_0022f93e:
            (this->field_0).common_ = cVar6;
            return;
          default:
            uVar3 = *(undefined8 *)&other->field_0;
            iVar7 = (other->field_0).int64_.val_;
            iVar4 = (this->field_0).int64_.val_;
            *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
            (other->field_0).int64_.val_ = iVar4;
            *(undefined8 *)&this->field_0 = uVar3;
            (this->field_0).int64_.val_ = iVar7;
            return;
          case 6:
            hVar2 = (other->field_0).half_float_;
            iVar7 = (this->field_0).int64_.val_;
            *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
            (other->field_0).int64_.val_ = iVar7;
            (this->field_0).half_float_ = hVar2;
            return;
          case 7:
            basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
            swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::uint64_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                      ();
            return;
          case 10:
          case 0xb:
            switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
            case 0:
            case 4:
              cVar6 = (other->field_0).common_;
              (other->field_0).half_float_ = (this->field_0).half_float_;
              break;
            case 1:
              bVar1 = (other->field_0).boolean_.val_;
              cVar6 = (other->field_0).common_;
              (other->field_0).half_float_ = (this->field_0).half_float_;
              (this->field_0).boolean_.val_ = bVar1;
              break;
            default:
              uVar3 = *(undefined8 *)&other->field_0;
              iVar7 = (other->field_0).int64_.val_;
              (other->field_0).half_float_ = (this->field_0).half_float_;
              *(undefined8 *)&this->field_0 = uVar3;
              (this->field_0).int64_.val_ = iVar7;
              return;
            case 6:
              hVar2 = (other->field_0).half_float_;
              (other->field_0).half_float_ = (this->field_0).half_float_;
              (this->field_0).half_float_ = hVar2;
              return;
            case 7:
              basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
              swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::half_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                        ();
              return;
            case 10:
            case 0xb:
              switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
              case 0:
              case 4:
                cVar6 = (other->field_0).common_;
                iVar7 = (this->field_0).int64_.val_;
                *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                (other->field_0).int64_.val_ = iVar7;
                goto LAB_0022fa84;
              case 1:
                bVar1 = (other->field_0).boolean_.val_;
                cVar6 = (other->field_0).common_;
                iVar7 = (this->field_0).int64_.val_;
                *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                (other->field_0).int64_.val_ = iVar7;
                (this->field_0).boolean_.val_ = bVar1;
LAB_0022fa84:
                (this->field_0).common_ = cVar6;
                return;
              default:
                uVar3 = *(undefined8 *)&other->field_0;
                iVar7 = (other->field_0).int64_.val_;
                iVar4 = (this->field_0).int64_.val_;
                *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                (other->field_0).int64_.val_ = iVar4;
                *(undefined8 *)&this->field_0 = uVar3;
                (this->field_0).int64_.val_ = iVar7;
                return;
              case 6:
                hVar2 = (other->field_0).half_float_;
                iVar7 = (this->field_0).int64_.val_;
                *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                (other->field_0).int64_.val_ = iVar7;
                (this->field_0).half_float_ = hVar2;
                return;
              case 7:
                basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::double_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                          ();
                return;
              case 10:
              case 0xb:
                switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
                case 0:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::null_storage>
                            ();
                  return;
                case 1:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::bool_storage>
                            ();
                  return;
                case 2:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::int64_storage>
                            ();
                  return;
                case 3:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::uint64_storage>
                            ();
                  return;
                case 4:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::empty_object_storage>
                            ();
                  return;
                case 5:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::double_storage>
                            ();
                  return;
                case 6:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::half_storage>
                            ();
                  return;
                case 7:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                            ();
                  return;
                case 8:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
                            ();
                  return;
                case 9:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
                            ();
                  return;
                case 0xc:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage>
                            ();
                  return;
                case 0xd:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
                            ();
                  return;
                case 0xe:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                            ();
                  return;
                case 0xf:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage>
                            ();
                  return;
                }
                switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
                case 0:
                case 4:
                  cVar6 = (other->field_0).common_;
                  (other->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
                  (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
                  (other->field_0).int64_.val_ = (this->field_0).int64_.val_;
                  break;
                case 1:
                  bVar1 = (other->field_0).boolean_.val_;
                  cVar6 = (other->field_0).common_;
                  (other->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
                  (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
                  (other->field_0).int64_.val_ = (this->field_0).int64_.val_;
                  (this->field_0).boolean_.val_ = bVar1;
                  break;
                default:
                  uVar3 = *(undefined8 *)&other->field_0;
                  iVar7 = (other->field_0).int64_.val_;
                  (other->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
                  (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
                  (other->field_0).int64_.val_ = (this->field_0).int64_.val_;
                  *(undefined8 *)&this->field_0 = uVar3;
                  (this->field_0).int64_.val_ = iVar7;
                  return;
                case 6:
                  hVar2 = (other->field_0).half_float_;
                  (other->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
                  (other->field_0).common_.tag_ = (this->field_0).common_.tag_;
                  (other->field_0).int64_.val_ = (this->field_0).int64_.val_;
                  (this->field_0).half_float_ = hVar2;
                  return;
                case 7:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                            ();
                  return;
                case 10:
                case 0xb:
                  switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
                  case 0:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::null_storage>
                              ();
                    return;
                  case 1:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::bool_storage>
                              ();
                    return;
                  case 2:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::int64_storage>
                              ();
                    return;
                  case 3:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::uint64_storage>
                              ();
                    return;
                  case 4:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::empty_object_storage>
                              ();
                    return;
                  case 5:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::double_storage>
                              ();
                    return;
                  case 6:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::half_storage>
                              ();
                    return;
                  case 7:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                              ();
                    return;
                  case 8:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
                              ();
                    return;
                  case 9:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
                              ();
                    return;
                  case 0xc:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage>
                              ();
                    return;
                  case 0xd:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
                              ();
                    return;
                  case 0xe:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                              ();
                    return;
                  case 0xf:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage>
                              ();
                    return;
                  }
                  switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
                  case 0:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::null_storage>
                              ();
                    return;
                  case 1:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::bool_storage>
                              ();
                    return;
                  case 2:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::int64_storage>
                              ();
                    return;
                  case 3:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::uint64_storage>
                              ();
                    return;
                  case 4:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::empty_object_storage>
                              ();
                    return;
                  case 5:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::double_storage>
                              ();
                    return;
                  case 6:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::half_storage>
                              ();
                    return;
                  case 7:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                              ();
                    return;
                  case 8:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
                              ();
                    return;
                  case 9:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
                              ();
                    return;
                  default:
                    switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
                    case 0:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::null_storage>
                                ();
                      return;
                    case 1:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::bool_storage>
                                ();
                      return;
                    case 2:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::int64_storage>
                                ();
                      return;
                    case 3:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::uint64_storage>
                                ();
                      return;
                    case 4:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::empty_object_storage>
                                ();
                      return;
                    case 5:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::double_storage>
                                ();
                      return;
                    case 6:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::half_storage>
                                ();
                      return;
                    case 7:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                                ();
                      return;
                    case 8:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
                                ();
                      return;
                    case 9:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
                                ();
                      return;
                    case 0xc:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage>
                                ();
                      return;
                    case 0xd:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
                                ();
                      return;
                    case 0xe:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                                ();
                      return;
                    case 0xf:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage>
                                ();
                      return;
                    }
                    break;
                  case 0xc:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage>
                              ();
                    return;
                  case 0xd:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
                              ();
                    return;
                  case 0xe:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                              ();
                    return;
                  case 0xf:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage>
                              ();
                    return;
                  }
                  switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
                  case 0:
                  case 4:
                    cVar6 = (other->field_0).common_;
                    iVar7 = (this->field_0).int64_.val_;
                    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                    (other->field_0).int64_.val_ = iVar7;
                    goto LAB_0022fd5e;
                  case 1:
                    bVar1 = (other->field_0).boolean_.val_;
                    cVar6 = (other->field_0).common_;
                    iVar7 = (this->field_0).int64_.val_;
                    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                    (other->field_0).int64_.val_ = iVar7;
                    (this->field_0).boolean_.val_ = bVar1;
LAB_0022fd5e:
                    (this->field_0).common_ = cVar6;
                    return;
                  default:
                    uVar3 = *(undefined8 *)&other->field_0;
                    iVar7 = (other->field_0).int64_.val_;
                    iVar4 = (this->field_0).int64_.val_;
                    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                    (other->field_0).int64_.val_ = iVar4;
                    *(undefined8 *)&this->field_0 = uVar3;
                    (this->field_0).int64_.val_ = iVar7;
                    return;
                  case 6:
                    hVar2 = (other->field_0).half_float_;
                    iVar7 = (this->field_0).int64_.val_;
                    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                    (other->field_0).int64_.val_ = iVar7;
                    (this->field_0).half_float_ = hVar2;
                    return;
                  case 7:
                    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                              ();
                    return;
                  case 10:
                  case 0xb:
                    switch((byte)(other->field_0).json_const_pointer_ & 0xf) {
                    case 0:
                    case 4:
                      cVar6 = (other->field_0).common_;
                      iVar7 = (this->field_0).int64_.val_;
                      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                      (other->field_0).int64_.val_ = iVar7;
                      goto LAB_0022fe1a;
                    case 1:
                      bVar1 = (other->field_0).boolean_.val_;
                      cVar6 = (other->field_0).common_;
                      iVar7 = (this->field_0).int64_.val_;
                      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                      (other->field_0).int64_.val_ = iVar7;
                      (this->field_0).boolean_.val_ = bVar1;
LAB_0022fe1a:
                      (this->field_0).common_ = cVar6;
                      return;
                    default:
                      uVar3 = *(undefined8 *)&other->field_0;
                      iVar7 = (other->field_0).int64_.val_;
                      iVar4 = (this->field_0).int64_.val_;
                      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                      (other->field_0).int64_.val_ = iVar4;
                      *(undefined8 *)&this->field_0 = uVar3;
                      (this->field_0).int64_.val_ = iVar7;
                      return;
                    case 6:
                      hVar2 = (other->field_0).half_float_;
                      iVar7 = (this->field_0).int64_.val_;
                      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                      (other->field_0).int64_.val_ = iVar7;
                      (this->field_0).half_float_ = hVar2;
                      return;
                    case 7:
                      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::short_string_storage>
                                ();
                      return;
                    case 10:
                    case 0xb:
                      short_string_storage::short_string_storage
                                (&sStack_28,(short_string_storage *)other);
                      (other->field_0).common_ = (this->field_0).common_;
                      short_string_storage::short_string_storage
                                ((short_string_storage *)this,&sStack_28);
                      return;
                    case 0xc:
                      sVar5 = (other->field_0).common_.tag_;
                      iVar7 = (other->field_0).int64_.val_;
                      iVar4 = (this->field_0).int64_.val_;
                      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                      (other->field_0).int64_.val_ = iVar4;
                      (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xc;
                      break;
                    case 0xd:
                      sVar5 = (other->field_0).common_.tag_;
                      iVar7 = (other->field_0).int64_.val_;
                      iVar4 = (this->field_0).int64_.val_;
                      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                      (other->field_0).int64_.val_ = iVar4;
                      (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xd;
                      break;
                    case 0xe:
                      sVar5 = (other->field_0).common_.tag_;
                      iVar7 = (other->field_0).int64_.val_;
                      iVar4 = (this->field_0).int64_.val_;
                      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                      (other->field_0).int64_.val_ = iVar4;
                      (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xe;
                      break;
                    case 0xf:
                      sVar5 = (other->field_0).common_.tag_;
                      iVar7 = (other->field_0).int64_.val_;
                      iVar4 = (this->field_0).int64_.val_;
                      *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                      (other->field_0).int64_.val_ = iVar4;
                      (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
                    }
                    (this->field_0).common_.tag_ = sVar5;
                    (this->field_0).int64_.val_ = iVar7;
                    return;
                  case 0xc:
                    sVar5 = (other->field_0).common_.tag_;
                    iVar7 = (other->field_0).int64_.val_;
                    iVar4 = (this->field_0).int64_.val_;
                    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                    (other->field_0).int64_.val_ = iVar4;
                    (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xc;
                    break;
                  case 0xd:
                    sVar5 = (other->field_0).common_.tag_;
                    iVar7 = (other->field_0).int64_.val_;
                    iVar4 = (this->field_0).int64_.val_;
                    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                    (other->field_0).int64_.val_ = iVar4;
                    (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xd;
                    break;
                  case 0xe:
                    sVar5 = (other->field_0).common_.tag_;
                    iVar7 = (other->field_0).int64_.val_;
                    iVar4 = (this->field_0).int64_.val_;
                    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                    (other->field_0).int64_.val_ = iVar4;
                    (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xe;
                    break;
                  case 0xf:
                    sVar5 = (other->field_0).common_.tag_;
                    iVar7 = (other->field_0).int64_.val_;
                    iVar4 = (this->field_0).int64_.val_;
                    *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                    (other->field_0).int64_.val_ = iVar4;
                    (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
                  }
                  (this->field_0).common_.tag_ = sVar5;
                  (this->field_0).int64_.val_ = iVar7;
                  return;
                case 0xc:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage>
                            ();
                  return;
                case 0xd:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
                            ();
                  return;
                case 0xe:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                            ();
                  return;
                case 0xf:
                  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                  swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::long_string_storage>
                            ();
                  return;
                }
                (this->field_0).common_ = cVar6;
                return;
              case 0xc:
                sVar5 = (other->field_0).common_.tag_;
                iVar7 = (other->field_0).int64_.val_;
                iVar4 = (this->field_0).int64_.val_;
                *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                (other->field_0).int64_.val_ = iVar4;
                (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xc;
                break;
              case 0xd:
                sVar5 = (other->field_0).common_.tag_;
                iVar7 = (other->field_0).int64_.val_;
                iVar4 = (this->field_0).int64_.val_;
                *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                (other->field_0).int64_.val_ = iVar4;
                (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xd;
                break;
              case 0xe:
                sVar5 = (other->field_0).common_.tag_;
                iVar7 = (other->field_0).int64_.val_;
                iVar4 = (this->field_0).int64_.val_;
                *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                (other->field_0).int64_.val_ = iVar4;
                (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xe;
                break;
              case 0xf:
                sVar5 = (other->field_0).common_.tag_;
                iVar7 = (other->field_0).int64_.val_;
                iVar4 = (this->field_0).int64_.val_;
                *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
                (other->field_0).int64_.val_ = iVar4;
                (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
              }
              (this->field_0).common_.tag_ = sVar5;
              (this->field_0).int64_.val_ = iVar7;
              return;
            case 0xc:
              basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
              swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::half_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage>
                        ();
              return;
            case 0xd:
              basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
              swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::half_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
                        ();
              return;
            case 0xe:
              basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
              swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::half_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                        ();
              return;
            case 0xf:
              sVar5 = (other->field_0).common_.tag_;
              iVar7 = (other->field_0).int64_.val_;
              (other->field_0).half_float_ = (this->field_0).half_float_;
              (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
              (this->field_0).common_.tag_ = sVar5;
              (this->field_0).int64_.val_ = iVar7;
              return;
            }
            (this->field_0).common_ = cVar6;
            return;
          case 0xc:
            sVar5 = (other->field_0).common_.tag_;
            iVar7 = (other->field_0).int64_.val_;
            iVar4 = (this->field_0).int64_.val_;
            *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
            (other->field_0).int64_.val_ = iVar4;
            (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xc;
            break;
          case 0xd:
            sVar5 = (other->field_0).common_.tag_;
            iVar7 = (other->field_0).int64_.val_;
            iVar4 = (this->field_0).int64_.val_;
            *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
            (other->field_0).int64_.val_ = iVar4;
            (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xd;
            break;
          case 0xe:
            sVar5 = (other->field_0).common_.tag_;
            iVar7 = (other->field_0).int64_.val_;
            iVar4 = (this->field_0).int64_.val_;
            *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
            (other->field_0).int64_.val_ = iVar4;
            (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xe;
            break;
          case 0xf:
            sVar5 = (other->field_0).common_.tag_;
            iVar7 = (other->field_0).int64_.val_;
            iVar4 = (this->field_0).int64_.val_;
            *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
            (other->field_0).int64_.val_ = iVar4;
            (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
          }
          (this->field_0).common_.tag_ = sVar5;
          (this->field_0).int64_.val_ = iVar7;
          return;
        case 0xc:
          sVar5 = (other->field_0).common_.tag_;
          iVar7 = (other->field_0).int64_.val_;
          iVar4 = (this->field_0).int64_.val_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).int64_.val_ = iVar4;
          (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xc;
          break;
        case 0xd:
          sVar5 = (other->field_0).common_.tag_;
          iVar7 = (other->field_0).int64_.val_;
          iVar4 = (this->field_0).int64_.val_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).int64_.val_ = iVar4;
          (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xd;
          break;
        case 0xe:
          sVar5 = (other->field_0).common_.tag_;
          iVar7 = (other->field_0).int64_.val_;
          iVar4 = (this->field_0).int64_.val_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).int64_.val_ = iVar4;
          (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xe;
          break;
        case 0xf:
          sVar5 = (other->field_0).common_.tag_;
          iVar7 = (other->field_0).int64_.val_;
          iVar4 = (this->field_0).int64_.val_;
          *(undefined8 *)&other->field_0 = *(undefined8 *)&this->field_0;
          (other->field_0).int64_.val_ = iVar4;
          (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
        }
        (this->field_0).common_.tag_ = sVar5;
        (this->field_0).int64_.val_ = iVar7;
        return;
      case 0xc:
        sVar5 = (other->field_0).common_.tag_;
        iVar7 = (other->field_0).int64_.val_;
        (other->field_0).common_ = (this->field_0).common_;
        (other->field_0).boolean_.val_ = (this->field_0).boolean_.val_;
        (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xc;
        break;
      case 0xd:
        sVar5 = (other->field_0).common_.tag_;
        iVar7 = (other->field_0).int64_.val_;
        (other->field_0).common_ = (this->field_0).common_;
        (other->field_0).boolean_.val_ = (this->field_0).boolean_.val_;
        (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xd;
        break;
      case 0xe:
        sVar5 = (other->field_0).common_.tag_;
        iVar7 = (other->field_0).int64_.val_;
        (other->field_0).common_ = (this->field_0).common_;
        (other->field_0).boolean_.val_ = (this->field_0).boolean_.val_;
        (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xe;
        break;
      case 0xf:
        sVar5 = (other->field_0).common_.tag_;
        iVar7 = (other->field_0).int64_.val_;
        (other->field_0).common_ = (this->field_0).common_;
        (other->field_0).boolean_.val_ = (this->field_0).boolean_.val_;
        (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
      }
      (this->field_0).common_.tag_ = sVar5;
      (this->field_0).int64_.val_ = iVar7;
      return;
    case 0xc:
      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::empty_object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage>
                ();
      return;
    case 0xd:
      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::empty_object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
                ();
      return;
    case 0xe:
      basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
      swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::empty_object_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                ();
      return;
    case 0xf:
      sVar5 = (other->field_0).common_.tag_;
      iVar7 = (other->field_0).int64_.val_;
      (other->field_0).common_ = (this->field_0).common_;
      (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
      (this->field_0).common_.tag_ = sVar5;
      (this->field_0).int64_.val_ = iVar7;
      return;
    }
    (this->field_0).common_ = cVar6;
    return;
  case 0xc:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::null_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage>
              ();
    return;
  case 0xd:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::null_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
              ();
    return;
  case 0xe:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::null_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
              ();
    return;
  case 0xf:
    sVar5 = (other->field_0).common_.tag_;
    iVar7 = (other->field_0).int64_.val_;
    (other->field_0).common_ = (this->field_0).common_;
    (this->field_0).json_const_pointer_ = (json_const_reference_storage)0xf;
    (this->field_0).common_.tag_ = sVar5;
    (this->field_0).int64_.val_ = iVar7;
    return;
  }
  (this->field_0).common_ = cVar6;
  return;
}

Assistant:

void swap(basic_json& other) noexcept
        {
            if (this == &other)
            {
                return;
            }
            if (is_trivial_storage(storage_kind()) && is_trivial_storage(other.storage_kind()))
            {
                basic_json temp;               
                std::memcpy(static_cast<void*>(&temp), static_cast<void*>(&other), sizeof(basic_json));
                std::memcpy(static_cast<void*>(&other), static_cast<void*>(this), sizeof(basic_json));
                std::memcpy(static_cast<void*>(this), static_cast<void*>(&temp), sizeof(basic_json));
            }
            else
            {
                switch (storage_kind())
                {
                    case json_storage_kind::null: swap_l<null_storage>(other); break;
                    case json_storage_kind::empty_object : swap_l<empty_object_storage>(other); break;
                    case json_storage_kind::boolean: swap_l<bool_storage>(other); break;
                    case json_storage_kind::int64: swap_l<int64_storage>(other); break;
                    case json_storage_kind::uint64: swap_l<uint64_storage>(other); break;
                    case json_storage_kind::half_float: swap_l<half_storage>(other); break;
                    case json_storage_kind::float64: swap_l<double_storage>(other); break;
                    case json_storage_kind::short_str: swap_l<short_string_storage>(other); break;
                    case json_storage_kind::long_str: swap_l<long_string_storage>(other); break;
                    case json_storage_kind::byte_str: swap_l<byte_string_storage>(other); break;
                    case json_storage_kind::array: swap_l<array_storage>(other); break;
                    case json_storage_kind::object: swap_l<object_storage>(other); break;
                    case json_storage_kind::json_const_reference: swap_l<json_const_reference_storage>(other); break;
                    case json_storage_kind::json_reference: swap_l<json_reference_storage>(other); break;
                    default:
                        JSONCONS_UNREACHABLE();
                        break;
                }
            }
        }